

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.h
# Opt level: O0

void * __thiscall duckdb_re2::Prog::PrefixAccel(Prog *this,void *data,size_t size)

{
  void *pvVar1;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *in_stack_00000020;
  Prog *in_stack_00000028;
  Prog *in_stack_fffffffffffffff8;
  
  if ((*(byte *)((long)in_RDI + 0x18) & 1) == 0) {
    if (*(long *)((long)in_RDI + 0x20) == 1) {
      pvVar1 = memchr(in_RSI,*(int *)((long)in_RDI + 0x28),in_RDX);
    }
    else {
      pvVar1 = PrefixAccel_FrontAndBack(in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI);
    }
  }
  else {
    pvVar1 = PrefixAccel_ShiftDFA(in_stack_00000028,in_stack_00000020,(size_t)this);
  }
  return pvVar1;
}

Assistant:

const void* PrefixAccel(const void* data, size_t size) {
    DCHECK(can_prefix_accel());
    if (prefix_foldcase_) {
      return PrefixAccel_ShiftDFA(data, size);
    } else if (prefix_size_ != 1) {
      return PrefixAccel_FrontAndBack(data, size);
    } else {
      return memchr(data, prefix_front_back.prefix_front_, size);
    }
  }